

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icupkg.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  FILE *__stream;
  byte bVar3;
  UBool UVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  int32_t iVar8;
  char *pname;
  Package *this;
  char *filesPath;
  size_t sVar9;
  Package *pPVar10;
  Package *pPVar11;
  FileStream *fileStream;
  Item *pIVar12;
  char *pcVar13;
  char *outComment;
  char *__s1;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  size_t sStack_470;
  char suffix [6];
  char *local_448;
  undefined8 local_440;
  char outFilenameBuffer [1024];
  
  pname = findBasename(*argv);
  uVar6 = u_parseArgs(argc,argv,0x11,options);
  if (options[1].doesOccur != '\0' || options[0].doesOccur != '\0') {
    printUsage(pname,'\x01');
    return 0;
  }
  this = (Package *)operator_new(0x31218);
  icu_63::Package::Package(this);
  bVar14 = options[0xe].doesOccur != '\0';
  if ((bool)bVar14) {
    this->doAutoPrefix = '\x01';
  }
  if (options[0xf].doesOccur != '\0') {
    if (options[0x10].doesOccur == '\0') {
      this->doAutoPrefix = '\x01';
      this->prefixEndsWithType = '\x01';
      bVar14 = bVar14 + 1;
      goto LAB_001ec7e2;
    }
    pcVar13 = "icupkg: --auto_toc_prefix_with_type and also --toc_prefix\n";
    sStack_470 = 0x3a;
LAB_001ecca2:
    fwrite(pcVar13,sStack_470,1,_stderr);
    goto LAB_001ec7fa;
  }
LAB_001ec7e2:
  if (1 < bVar14 || uVar6 - 4 < 0xfffffffe) goto LAB_001ec7fa;
  pcVar13 = (char *)0x0;
  if (options[5].doesOccur != '\0') {
    pcVar13 = options[5].value;
  }
  filesPath = (char *)0x0;
  if (options[6].doesOccur != '\0') {
    filesPath = options[6].value;
  }
  __s1 = argv[1];
  iVar7 = strcmp(__s1,"new");
  if (iVar7 == 0) {
    if (bVar14 != 0) {
      pcVar13 = "icupkg: --auto_toc_prefix[_with_type] but no input package\n";
      sStack_470 = 0x3b;
      goto LAB_001ecca2;
    }
    local_448 = (char *)0x0;
LAB_001ec8f5:
    if (uVar6 < 3) {
      bVar15 = false;
      __s1 = (char *)0x0;
      bVar2 = false;
      if (options[2].doesOccur != '\0') goto LAB_001ec959;
LAB_001eca4f:
      bVar14 = icu_63::Package::getInType(this);
      bVar1 = true;
      if (options[7].doesOccur == '\0') {
        bVar1 = bVar15;
      }
LAB_001eca6a:
      outComment = (char *)0x0;
      if (options[3].doesOccur != '\0') {
        outComment = 
        " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
        ;
      }
      if (options[4].doesOccur != '\0') {
        outComment = options[4].value;
      }
      if (options[8].doesOccur != '\0') {
        iVar7 = strcmp(options[8].value,"noslash");
        if (iVar7 != 0) goto LAB_001ec7fa;
        icu_63::Package::setMatchMode(this,1);
      }
      if (options[10].doesOccur != '\0') {
        pPVar10 = (Package *)operator_new(0x31218);
        icu_63::Package::Package(pPVar10);
        pPVar11 = readList((char *)0x0,options[10].value,'\0',pPVar10);
        if (pPVar11 == (Package *)0x0) goto LAB_001ec7fa;
        icu_63::Package::removeItems(this,pPVar10);
        icu_63::Package::~Package(pPVar10);
        operator_delete(pPVar10);
        bVar1 = true;
      }
      if (options[9].doesOccur == '\0') {
        local_440 = (Package *)0x0;
      }
      else {
        pPVar10 = (Package *)operator_new(0x31218);
        icu_63::Package::Package(pPVar10);
        pPVar11 = readList(pcVar13,options[9].value,'\x01',pPVar10);
        if (pPVar11 == (Package *)0x0) {
          printUsage(pname,'\0');
          return 1;
        }
        local_440 = pPVar10;
        icu_63::Package::addItems(this,pPVar10);
        bVar1 = true;
      }
      if (options[0xb].doesOccur == '\0') {
LAB_001ecc06:
        if (options[0xc].doesOccur != '\0') {
          if (options[0xd].doesOccur == '\0') {
            for (iVar7 = 0; iVar8 = icu_63::Package::getItemCount(this), __stream = _stdout,
                iVar7 < iVar8; iVar7 = iVar7 + 1) {
              pIVar12 = icu_63::Package::getItem(this,iVar7);
              fprintf(__stream,"%s\n",pIVar12->name);
            }
          }
          else {
            fileStream = T_FileStream_open(options[0xd].value,"w");
            if (fileStream == (FileStream *)0x0) {
              return 1;
            }
            for (iVar7 = 0; iVar8 = icu_63::Package::getItemCount(this), iVar7 < iVar8;
                iVar7 = iVar7 + 1) {
              pIVar12 = icu_63::Package::getItem(this,iVar7);
              T_FileStream_writeLine(fileStream,pIVar12->name);
              T_FileStream_writeLine(fileStream,"\n");
            }
            T_FileStream_close(fileStream);
          }
        }
        UVar4 = icu_63::Package::checkDependencies(this);
        pPVar10 = local_440;
        if (UVar4 != '\0') {
          if (bVar1) {
            if ((__s1 == (char *)0x0) || (*__s1 == '\0')) {
              if ((local_448 == (char *)0x0) || (*local_448 == '\0')) {
                fwrite("icupkg: unable to auto-generate an output filename if there is no input filename\n"
                       ,0x51,1,_stderr);
                exit(1);
              }
              builtin_strncpy(suffix,"?.dat",6);
              cVar5 = icu_63::Package::getInType(this);
              suffix[0] = cVar5;
              __s1 = outFilenameBuffer;
              strcpy(__s1,local_448);
              sVar9 = strlen(__s1);
              if (5 < (long)sVar9) {
                iVar7 = bcmp(outFilenameBuffer + (sVar9 - 5),suffix,5);
                if (iVar7 == 0) {
                  outFilenameBuffer[sVar9 - 5] = bVar14;
                }
              }
            }
            if (options[0x10].doesOccur != '\0') {
              icu_63::Package::setPrefix(this,options[0x10].value);
            }
            iVar7 = writePackageDatFile(__s1,outComment,(char *)0x0,(char *)0x0,this,bVar14);
          }
          else {
            iVar7 = 0;
          }
          if (pPVar10 != (Package *)0x0) {
            icu_63::Package::~Package(pPVar10);
          }
          operator_delete(pPVar10);
          icu_63::Package::~Package(this);
          operator_delete(this);
          return iVar7;
        }
        return 2;
      }
      pPVar10 = (Package *)operator_new(0x31218);
      icu_63::Package::Package(pPVar10);
      pPVar11 = readList((char *)0x0,options[0xb].value,'\0',pPVar10);
      if (pPVar11 != (Package *)0x0) {
        icu_63::Package::extractItems(this,filesPath,pPVar10,bVar14);
        icu_63::Package::~Package(pPVar10);
        operator_delete(pPVar10);
        goto LAB_001ecc06;
      }
      goto LAB_001ec7fa;
    }
    bVar2 = false;
LAB_001ec8fe:
    __s1 = argv[2];
    iVar7 = strcmp(argv[1],__s1);
    bVar15 = iVar7 != 0;
    if (options[2].doesOccur == '\0') {
      if (!bVar2) goto LAB_001eca4f;
      goto LAB_001ec926;
    }
LAB_001ec959:
    bVar14 = *options[2].value;
    if ((((bVar14 == 0) || (options[2].value[1] != '\0')) || (10 < bVar14 - 0x62)) ||
       ((0x409U >> (bVar14 - 0x62 & 0x1f) & 1) == 0)) goto LAB_001ec7fa;
    bVar16 = true;
    if (!bVar2) {
      bVar3 = icu_63::Package::getInType(this);
      bVar16 = bVar14 != bVar3;
    }
    bVar1 = true;
    if (options[7].doesOccur == '\0') {
      bVar1 = (bool)(bVar16 | bVar15);
    }
    if (!bVar2) goto LAB_001eca6a;
  }
  else {
    sVar9 = strlen(__s1);
    local_448 = __s1;
    if ((4 < (int)sVar9) && (iVar7 = strcmp(__s1 + ((int)sVar9 - 4),".dat"), iVar7 == 0)) {
      icu_63::Package::readPackage(this,__s1);
      goto LAB_001ec8f5;
    }
    icu_63::Package::addFile(this,pcVar13,__s1);
    if (2 < uVar6) {
      bVar2 = true;
      goto LAB_001ec8fe;
    }
    bVar15 = pcVar13 != filesPath;
    bVar2 = true;
    if (options[2].doesOccur != '\0') goto LAB_001ec959;
LAB_001ec926:
    bVar1 = true;
    if (options[7].doesOccur == '\0') {
      bVar1 = bVar15;
    }
    bVar14 = 0;
  }
  if ((((options[4].doesOccur == '\0') && (options[3].doesOccur == '\0')) &&
      ((options[8].doesOccur == '\0' &&
       (((options[10].doesOccur == '\0' && (options[9].doesOccur == '\0')) &&
        (options[0xb].doesOccur == '\0')))))) && (options[0xc].doesOccur == '\0')) {
    if (bVar1) {
      icu_63::Package::extractItem(this,filesPath,__s1,0,bVar14);
    }
    icu_63::Package::~Package(this);
    operator_delete(this);
    return 0;
  }
LAB_001ec7fa:
  printUsage(pname,'\0');
  return 1;
}

Assistant:

extern int
main(int argc, char *argv[]) {
    const char *pname, *sourcePath, *destPath, *inFilename, *outFilename, *outComment;
    char outType;
    UBool isHelp, isModified, isPackage;
    int result = 0;

    Package *pkg, *listPkg, *addListPkg;

    U_MAIN_INIT_ARGS(argc, argv);

    /* get the program basename */
    pname=findBasename(argv[0]);

    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);
    isHelp=options[OPT_HELP_H].doesOccur || options[OPT_HELP_QUESTION_MARK].doesOccur;
    if(isHelp) {
        printUsage(pname, TRUE);
        return U_ZERO_ERROR;
    }

    pkg=new Package;
    if(pkg==NULL) {
        fprintf(stderr, "icupkg: not enough memory\n");
        return U_MEMORY_ALLOCATION_ERROR;
    }
    isModified=FALSE;

    int autoPrefix=0;
    if(options[OPT_AUTO_TOC_PREFIX].doesOccur) {
        pkg->setAutoPrefix();
        ++autoPrefix;
    }
    if(options[OPT_AUTO_TOC_PREFIX_WITH_TYPE].doesOccur) {
        if(options[OPT_TOC_PREFIX].doesOccur) {
            fprintf(stderr, "icupkg: --auto_toc_prefix_with_type and also --toc_prefix\n");
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
        pkg->setAutoPrefixWithType();
        ++autoPrefix;
    }
    if(argc<2 || 3<argc || autoPrefix>1) {
        printUsage(pname, FALSE);
        return U_ILLEGAL_ARGUMENT_ERROR;
    }

    if(options[OPT_SOURCEDIR].doesOccur) {
        sourcePath=options[OPT_SOURCEDIR].value;
    } else {
        // work relative to the current working directory
        sourcePath=NULL;
    }
    if(options[OPT_DESTDIR].doesOccur) {
        destPath=options[OPT_DESTDIR].value;
    } else {
        // work relative to the current working directory
        destPath=NULL;
    }

    if(0==strcmp(argv[1], "new")) {
        if(autoPrefix) {
            fprintf(stderr, "icupkg: --auto_toc_prefix[_with_type] but no input package\n");
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
        inFilename=NULL;
        isPackage=TRUE;
    } else {
        inFilename=argv[1];
        if(isPackageName(inFilename)) {
            pkg->readPackage(inFilename);
            isPackage=TRUE;
        } else {
            /* swap a single file (icuswap replacement) rather than work on a package */
            pkg->addFile(sourcePath, inFilename);
            isPackage=FALSE;
        }
    }

    if(argc>=3) {
        outFilename=argv[2];
        if(0!=strcmp(argv[1], argv[2])) {
            isModified=TRUE;
        }
    } else if(isPackage) {
        outFilename=NULL;
    } else /* !isPackage */ {
        outFilename=inFilename;
        isModified=(UBool)(sourcePath!=destPath);
    }

    /* parse the output type option */
    if(options[OPT_OUT_TYPE].doesOccur) {
        const char *type=options[OPT_OUT_TYPE].value;
        if(type[0]==0 || type[1]!=0) {
            /* the type must be exactly one letter */
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
        outType=type[0];
        switch(outType) {
        case 'l':
        case 'b':
        case 'e':
            break;
        default:
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }

        /*
         * Set the isModified flag if the output type differs from the
         * input package type.
         * If we swap a single file, just assume that we are modifying it.
         * The Package class does not give us access to the item and its type.
         */
        isModified|=(UBool)(!isPackage || outType!=pkg->getInType());
    } else if(isPackage) {
        outType=pkg->getInType(); // default to input type
    } else /* !isPackage: swap single file */ {
        outType=0; /* tells extractItem() to not swap */
    }

    if(options[OPT_WRITEPKG].doesOccur) {
        isModified=TRUE;
    }

    if(!isPackage) {
        /*
         * icuswap tool replacement: Only swap a single file.
         * Check that irrelevant options are not set.
         */
        if( options[OPT_COMMENT].doesOccur ||
            options[OPT_COPYRIGHT].doesOccur ||
            options[OPT_MATCHMODE].doesOccur ||
            options[OPT_REMOVE_LIST].doesOccur ||
            options[OPT_ADD_LIST].doesOccur ||
            options[OPT_EXTRACT_LIST].doesOccur ||
            options[OPT_LIST_ITEMS].doesOccur
        ) {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
        if(isModified) {
            pkg->extractItem(destPath, outFilename, 0, outType);
        }

        delete pkg;
        return result;
    }

    /* Work with a package. */

    if(options[OPT_COMMENT].doesOccur) {
        outComment=options[OPT_COMMENT].value;
    } else if(options[OPT_COPYRIGHT].doesOccur) {
        outComment=U_COPYRIGHT_STRING;
    } else {
        outComment=NULL;
    }

    if(options[OPT_MATCHMODE].doesOccur) {
        if(0==strcmp(options[OPT_MATCHMODE].value, "noslash")) {
            pkg->setMatchMode(Package::MATCH_NOSLASH);
        } else {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
    }

    /* remove items */
    if(options[OPT_REMOVE_LIST].doesOccur) {
        listPkg=new Package();
        if(listPkg==NULL) {
            fprintf(stderr, "icupkg: not enough memory\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
        if(readList(NULL, options[OPT_REMOVE_LIST].value, FALSE, listPkg)) {
            pkg->removeItems(*listPkg);
            delete listPkg;
            isModified=TRUE;
        } else {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
    }

    /*
     * add items
     * use a separate Package so that its memory and items stay around
     * as long as the main Package
     */
    addListPkg=NULL;
    if(options[OPT_ADD_LIST].doesOccur) {
        addListPkg=new Package();
        if(addListPkg==NULL) {
            fprintf(stderr, "icupkg: not enough memory\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
        if(readList(sourcePath, options[OPT_ADD_LIST].value, TRUE, addListPkg)) {
            pkg->addItems(*addListPkg);
            // delete addListPkg; deferred until after writePackage()
            isModified=TRUE;
        } else {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
    }

    /* extract items */
    if(options[OPT_EXTRACT_LIST].doesOccur) {
        listPkg=new Package();
        if(listPkg==NULL) {
            fprintf(stderr, "icupkg: not enough memory\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
        if(readList(NULL, options[OPT_EXTRACT_LIST].value, FALSE, listPkg)) {
            pkg->extractItems(destPath, *listPkg, outType);
            delete listPkg;
        } else {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
    }

    /* list items */
    if(options[OPT_LIST_ITEMS].doesOccur) {
        int32_t i;
        if (options[OPT_LIST_FILE].doesOccur) {
            FileStream *out;
            out = T_FileStream_open(options[OPT_LIST_FILE].value, "w");
            if (out != NULL) {
                for(i=0; i<pkg->getItemCount(); ++i) {
                    T_FileStream_writeLine(out, pkg->getItem(i)->name);
                    T_FileStream_writeLine(out, "\n");
                }
                T_FileStream_close(out);
            } else {
                return U_ILLEGAL_ARGUMENT_ERROR;
            }
        } else {
            for(i=0; i<pkg->getItemCount(); ++i) {
                fprintf(stdout, "%s\n", pkg->getItem(i)->name);
            }
        }
    }

    /* check dependencies between items */
    if(!pkg->checkDependencies()) {
        /* some dependencies are not fulfilled */
        return U_MISSING_RESOURCE_ERROR;
    }

    /* write the output .dat package if there are any modifications */
    if(isModified) {
        char outFilenameBuffer[1024]; // for auto-generated output filename, if necessary

        if(outFilename==NULL || outFilename[0]==0) {
            if(inFilename==NULL || inFilename[0]==0) {
                fprintf(stderr, "icupkg: unable to auto-generate an output filename if there is no input filename\n");
                exit(U_ILLEGAL_ARGUMENT_ERROR);
            }

            /*
             * auto-generate a filename:
             * copy the inFilename,
             * and if the last basename character matches the input file's type,
             * then replace it with the output file's type
             */
            char suffix[6]="?.dat";
            char *s;

            suffix[0]=pkg->getInType();
            strcpy(outFilenameBuffer, inFilename);
            s=strchr(outFilenameBuffer, 0);
            if((s-outFilenameBuffer)>5 && 0==memcmp(s-5, suffix, 5)) {
                *(s-5)=outType;
            }
            outFilename=outFilenameBuffer;
        }
        if(options[OPT_TOC_PREFIX].doesOccur) {
            pkg->setPrefix(options[OPT_TOC_PREFIX].value);
        }
        result = writePackageDatFile(outFilename, outComment, NULL, NULL, pkg, outType);
    }

    delete addListPkg;
    delete pkg;
    return result;
}